

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clownlzss.c
# Opt level: O2

int ClownLZSS_FindOptimalMatches
              (int filler_value,size_t maximum_match_length,size_t maximum_match_distance,
              _func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr
              *extra_matches_callback,size_t literal_cost,
              _func_size_t_size_t_size_t_void_ptr *match_cost_callback,uchar *data,
              size_t bytes_per_value,size_t total_values,ClownLZSS_Match **_matches,
              size_t *_total_matches,void *user)

{
  ulong uVar1;
  anon_union_8_2_f60ed377_for_u *paVar2;
  byte bVar3;
  ulong uVar4;
  ClownLZSS_Match *pCVar5;
  size_t sVar6;
  anon_union_8_2_f60ed377_for_u *paVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  size_t *psVar11;
  ClownLZSS_Match *pCVar12;
  uchar *puVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  uchar *puVar20;
  uchar *puVar21;
  ulong uVar22;
  uchar *puVar23;
  
  sVar15 = 0;
  if (total_values == 0) {
    pCVar5 = (ClownLZSS_Match *)0x0;
  }
  else {
    pCVar5 = (ClownLZSS_Match *)malloc(total_values * 0x18 + maximum_match_distance * 0x10 + 0x818);
    if (pCVar5 == (ClownLZSS_Match *)0x0) {
      return 0;
    }
    uVar1 = total_values + 1;
    paVar2 = (anon_union_8_2_f60ed377_for_u *)&pCVar5[uVar1].source + maximum_match_distance;
    for (lVar14 = 0; lVar14 != 0x100; lVar14 = lVar14 + 1) {
      paVar2[maximum_match_distance + lVar14].cost = 0xffffffffffffffff;
    }
    if (filler_value == -1) {
      for (sVar15 = 0; maximum_match_distance != sVar15; sVar15 = sVar15 + 1) {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar5[uVar1].source)[sVar15].cost = 0xffffffffffffffff;
      }
    }
    else {
      sVar9 = maximum_match_distance - 1;
      sVar15 = (long)filler_value + maximum_match_distance;
      paVar2[sVar15].cost = sVar9;
      paVar2->cost = 0xffffffffffffffff;
      sVar19 = 0;
      sVar8 = sVar9;
      while (sVar6 = sVar19,
            ((anon_union_8_2_f60ed377_for_u *)&pCVar5[uVar1].source)[sVar8].cost = sVar15,
            sVar9 != sVar6) {
        (&pCVar5[total_values + 1].destination)[maximum_match_distance + sVar6] = sVar6;
        sVar15 = sVar6 + 1;
        sVar8 = sVar6;
        sVar19 = sVar15;
      }
    }
    ((anon_union_8_2_f60ed377_for_u *)&pCVar5->source)->cost = 0;
    pCVar12 = pCVar5;
    for (uVar16 = 1; pCVar12 = pCVar12 + 1, uVar16 < uVar1; uVar16 = uVar16 + 1) {
      ((anon_union_8_2_f60ed377_for_u *)&pCVar12->source)->cost = 0xffffffffffffffff;
    }
    uVar16 = 0;
    while (uVar22 = total_values - uVar16, uVar22 != 0) {
      bVar3 = data[uVar16 * bytes_per_value];
      uVar17 = uVar16 % maximum_match_distance;
      if (extra_matches_callback !=
          (_func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr *)0x0) {
        (*extra_matches_callback)(data,total_values,uVar16,(ClownLZSS_GraphEdge *)pCVar5,user);
      }
      sVar15 = bVar3 + maximum_match_distance;
      if (maximum_match_length <= uVar22) {
        uVar22 = maximum_match_length;
      }
      pCVar12 = pCVar5 + uVar16;
      paVar7 = paVar2 + sVar15;
      while (uVar4 = paVar7->cost, uVar4 != 0xffffffffffffffff) {
        uVar18 = (~uVar4 + uVar16 + maximum_match_distance) % maximum_match_distance;
        sVar19 = uVar18 + 1;
        puVar20 = data + ((bytes_per_value == 1) + uVar16) * bytes_per_value +
                  ~uVar18 * bytes_per_value;
        sVar9 = (ulong)(bytes_per_value == 1);
        puVar23 = data + ((bytes_per_value == 1) + uVar16) * bytes_per_value;
        while (uVar18 = sVar9, uVar18 < uVar22) {
          if (puVar20 < data) {
            puVar13 = puVar23 + bytes_per_value;
            for (sVar8 = 0; sVar9 = bytes_per_value, bytes_per_value != sVar8; sVar8 = sVar8 + 1) {
              if (puVar23[sVar8] != (uchar)filler_value) {
                puVar13 = puVar23 + sVar8 + 1;
                sVar9 = sVar8;
                break;
              }
            }
            puVar21 = puVar20 + bytes_per_value;
LAB_00108fd2:
            if (sVar9 != bytes_per_value) break;
          }
          else {
            puVar21 = puVar20 + bytes_per_value;
            puVar13 = puVar23 + bytes_per_value;
            for (sVar9 = 0; bytes_per_value != sVar9; sVar9 = sVar9 + 1) {
              if (puVar23[sVar9] != puVar20[sVar9]) {
                puVar21 = puVar20 + sVar9 + 1;
                puVar13 = puVar23 + sVar9 + 1;
                goto LAB_00108fd2;
              }
            }
          }
          sVar9 = uVar18 + 1;
          sVar8 = (*match_cost_callback)(sVar19,sVar9,user);
          puVar20 = puVar21;
          puVar23 = puVar13;
          if ((sVar8 != 0) &&
             (uVar10 = sVar8 + ((anon_union_8_2_f60ed377_for_u *)&pCVar12->source)->cost,
             uVar10 < ((anon_union_8_2_f60ed377_for_u *)&pCVar12[uVar18 + 1].source)->cost)) {
            ((anon_union_8_2_f60ed377_for_u *)&pCVar12[uVar18 + 1].source)->cost = uVar10;
            pCVar12[uVar18 + 1].destination = uVar16;
            pCVar12[uVar18 + 1].length = uVar16 - sVar19;
          }
        }
        paVar7 = paVar2 + uVar4;
      }
      sVar9 = uVar16 + 1;
      uVar22 = ((anon_union_8_2_f60ed377_for_u *)&pCVar12->source)->cost + literal_cost;
      if (uVar22 <= ((anon_union_8_2_f60ed377_for_u *)&pCVar5[sVar9].source)->cost) {
        pCVar12 = pCVar5 + sVar9;
        ((anon_union_8_2_f60ed377_for_u *)&pCVar12->source)->cost = uVar22;
        pCVar12->destination = uVar16;
        pCVar12->length = sVar9;
      }
      if (((anon_union_8_2_f60ed377_for_u *)&pCVar5[uVar1].source)[uVar17].cost !=
          0xffffffffffffffff) {
        paVar2[((anon_union_8_2_f60ed377_for_u *)&pCVar5[uVar1].source)[uVar17].cost].cost =
             0xffffffffffffffff;
      }
      ((anon_union_8_2_f60ed377_for_u *)&pCVar5[uVar1].source)[uVar17].cost = sVar15;
      sVar19 = paVar2[sVar15].cost;
      paVar2[uVar17].cost = sVar19;
      if (sVar19 != 0xffffffffffffffff) {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar5[uVar1].source)[sVar19].cost = uVar17;
      }
      paVar2[sVar15].cost = uVar17;
      uVar16 = sVar9;
    }
    pCVar5->destination = 0xffffffffffffffff;
    sVar15 = 0xffffffffffffffff;
    do {
      ((anon_union_8_2_f60ed377_for_u *)&pCVar5[total_values].source)->cost = sVar15;
      pCVar12 = pCVar5 + total_values;
      sVar15 = total_values;
      total_values = pCVar12->destination;
    } while (pCVar12->destination != 0xffffffffffffffff);
    psVar11 = &pCVar5->length;
    sVar15 = 0;
    sVar9 = 0;
    while (sVar19 = ((anon_union_8_2_f60ed377_for_u *)&pCVar5[sVar9].source)->cost,
          sVar19 != 0xffffffffffffffff) {
      ((ClownLZSS_GraphEdge *)(psVar11 + -2))->u =
           (anon_union_8_2_f60ed377_for_u)pCVar5[sVar19].length;
      psVar11[-1] = sVar9;
      *psVar11 = sVar19 - sVar9;
      sVar15 = sVar15 + 1;
      psVar11 = psVar11 + 3;
      sVar9 = sVar19;
    }
  }
  *_matches = pCVar5;
  *_total_matches = sVar15;
  return 1;
}

Assistant:

int ClownLZSS_FindOptimalMatches(
	const int filler_value,
	const size_t maximum_match_length,
	const size_t maximum_match_distance,
	void (* const extra_matches_callback)(const unsigned char *data, size_t total_values, size_t offset, ClownLZSS_GraphEdge *node_meta_array, void *user),
	const size_t literal_cost,
	size_t (* const match_cost_callback)(size_t distance, size_t length, void *user),
	const unsigned char* const data,
	const size_t bytes_per_value,
	const size_t total_values,
	ClownLZSS_Match** const _matches,
	size_t* const _total_matches,
	const void* const user
)
{
	int success;

	success = 0;

	/* Handle the edge-case where the data is empty. */
	if (total_values == 0)
	{
		*_matches = NULL;
		*_total_matches = 0;
		success = 1;
	}
	else
	{
		const size_t node_meta_array_length = total_values + 1; /* +1 for the end-node */
		const size_t string_list_buffer_length = maximum_match_distance * 2 + 0x100;
		ClownLZSS_GraphEdge* const node_meta_array = (ClownLZSS_GraphEdge*)malloc(node_meta_array_length * sizeof(ClownLZSS_GraphEdge) + string_list_buffer_length * sizeof(size_t));

		if (node_meta_array != NULL)
		{
			size_t i;
			ClownLZSS_Match *matches;
			size_t total_matches;

			size_t* const prev = (size_t*)&node_meta_array[node_meta_array_length];
			size_t* const next = &prev[maximum_match_distance];
			const size_t DUMMY = -1;

			/* Initialise the string list heads */
			for (i = 0; i < 0x100; ++i)
				next[maximum_match_distance + i] = DUMMY;

			if (filler_value == -1)
			{
				/* Initialise the string list nodes */
				for (i = 0; i < maximum_match_distance; ++i)
					prev[i] = DUMMY;
			}
			else
			{
				next[maximum_match_distance + filler_value] = maximum_match_distance - 1;
				next[0] = DUMMY;
				prev[maximum_match_distance - 1] = maximum_match_distance + filler_value;

				/* Initialise the string list nodes */
				for (i = 0; i < maximum_match_distance - 1; ++i)
				{
					next[i + 1] = i;
					prev[i] = i + 1;
				}
			}

			/* Set costs to maximum possible value, so later comparisons work */
			node_meta_array[0].u.cost = 0;
			for (i = 1; i < total_values + 1; ++i)
				node_meta_array[i].u.cost = DUMMY;

			/* Search for matches, to populate the edges of the LZSS graph.
			   Notably, while doing this, we're also using a shortest-path
			   algorithm on the edges to find the best combination of matches
			   to produce the smallest file. */

			/* Advance through the data one step at a time */
			for (i = 0; i < total_values; ++i)
			{
				size_t match_string;

				const size_t string_list_head = maximum_match_distance + data[i * bytes_per_value];
				const size_t current_string = i % maximum_match_distance;

				if (extra_matches_callback != NULL)
					extra_matches_callback(data, total_values, i, node_meta_array, (void*)user);

				/* `string_list_head` points to a linked-list of strings in the LZSS sliding window that match at least
				   one byte with the current string: iterate over it and generate every possible match for this string */
				for (match_string = next[string_list_head]; match_string != DUMMY; match_string = next[match_string])
				{
					size_t j;

					const size_t distance = ((maximum_match_distance + i - match_string - 1) % maximum_match_distance) + 1;
					/* If `BYTES_PER_VALUE` is not 1, then we have to re-evaluate the first value, otherwise we can skip it */
					const unsigned int start = bytes_per_value == 1;
					const unsigned char *current_bytes = &data[(i + start) * bytes_per_value];
					const unsigned char *match_bytes = current_bytes - distance * bytes_per_value;

					for (j = start; j < CLOWNLZSS_MIN(maximum_match_length, total_values - i); ++j)
					{
						size_t l;

						if (match_bytes < data)
						{
							for (l = 0; l < bytes_per_value; ++l)
							{
								const unsigned char current_byte = *current_bytes;
								const unsigned char match_byte = (unsigned char)filler_value;

								++current_bytes;

								if (current_byte != match_byte)
									break;
							}

							match_bytes += bytes_per_value;
						}
						else
						{
							for (l = 0; l < bytes_per_value; ++l)
							{
								const unsigned char current_byte = *current_bytes;
								const unsigned char match_byte = *match_bytes;

								++current_bytes;
								++match_bytes;

								if (current_byte != match_byte)
									break;
							}
						}

						if (l != bytes_per_value)
						{
							/* No match: give up on the current run */
							break;
						}
						else
						{
							/* Figure out how much it costs to encode the current run */
							const size_t cost = match_cost_callback(distance, j + 1, (void*)user);

							/* Figure out if the cost is lower than that of any other runs that end at the same value as this one */
							if (cost != 0 && node_meta_array[i + j + 1].u.cost > node_meta_array[i].u.cost + cost)
							{
								/* Record this new best run in the graph edge assigned to the value at the end of the run */
								node_meta_array[i + j + 1].u.cost = node_meta_array[i].u.cost + cost;
								node_meta_array[i + j + 1].previous_node_index = i;
								node_meta_array[i + j + 1].match_offset = i - distance;
							}
						}
					}
				}

				/* If a literal match is more efficient than all runs assigned to this value, then use that instead */
				if (node_meta_array[i + 1].u.cost >= node_meta_array[i].u.cost + literal_cost)
				{
					node_meta_array[i + 1].u.cost = node_meta_array[i].u.cost + literal_cost;
					node_meta_array[i + 1].previous_node_index = i;
					node_meta_array[i + 1].match_offset = i + 1;
				}

				/* Replace the oldest string in the list with the new string, since it's about to be pushed out of the LZSS sliding window */

				/* Detach the old node in this slot */
				if (prev[current_string] != DUMMY)
					next[prev[current_string]] = DUMMY;

				/* Replace the old node with this new one, and insert it at the start of its matching list */
				prev[current_string] = string_list_head;
				next[current_string] = next[string_list_head];

				if (next[current_string] != DUMMY)
					prev[next[current_string]] = current_string;

				next[string_list_head] = current_string;
			}

			/* At this point, the edges will have formed a shortest-path from the start to the end:
			   You just have to start at the last edge, and follow it backwards all the way to the start. */

			/* Mark start/end nodes for the following loops */
			node_meta_array[0].previous_node_index = DUMMY;
			node_meta_array[total_values].u.next_node_index = DUMMY;

			/* Reverse the direction of the edges, so we can parse the LZSS graph from start to end */
			for (i = total_values; node_meta_array[i].previous_node_index != DUMMY; i = node_meta_array[i].previous_node_index)
				node_meta_array[node_meta_array[i].previous_node_index].u.next_node_index = i;

			/* Produce an array of LZSS matches for the caller to process. It's safe to overwrite the LZSS graph to do this. */
			matches = (ClownLZSS_Match*)node_meta_array;
			total_matches = 0;

			i = 0;
			while (node_meta_array[i].u.next_node_index != DUMMY)
			{
				const size_t next_index = node_meta_array[i].u.next_node_index;
				const size_t offset = node_meta_array[next_index].match_offset;

				matches[total_matches].source = offset;
				matches[total_matches].destination = i;
				matches[total_matches].length = next_index - i;

				++total_matches;

				i = next_index;
			}

			*_matches = matches;
			*_total_matches = total_matches;
			success = 1;
		}
	}

	return success;
}